

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O3

void * __thiscall absl::debugging_internal::VDSOSupport::SetBase(VDSOSupport *this,void *base)

{
  byte bVar1;
  uint32_t uVar2;
  undefined *puVar3;
  undefined8 *extraout_RDX;
  SymbolIterator SStack_68;
  
  puVar3 = vdso_base_;
  if ((undefined4 *)base != &ElfMemImage::kInvalidBaseSentinel) {
    vdso_base_ = (undefined *)base;
    ElfMemImage::Init(&this->image_,base);
    getcpu_fn_ = InitAndGetCPU;
    return puVar3;
  }
  SetBase();
  SStack_68.index_ = 0;
  SStack_68.image_ = this;
  ElfMemImage::SymbolIterator::Update(&SStack_68,0);
  uVar2 = (this->image_).num_syms_;
  if (((VDSOSupport *)SStack_68.image_ != this) || (SStack_68.index_ != uVar2)) {
    do {
      if ((SStack_68.info_.address <= base) &&
         (base < (void *)((long)SStack_68.info_.address + (SStack_68.info_.symbol)->st_size))) {
        if (extraout_RDX == (undefined8 *)0x0) {
          return (void *)0x1;
        }
        bVar1 = (SStack_68.info_.symbol)->st_info;
        extraout_RDX[2] = SStack_68.info_.address;
        extraout_RDX[3] = SStack_68.info_.symbol;
        *extraout_RDX = SStack_68.info_.name;
        extraout_RDX[1] = SStack_68.info_.version;
        if ((bVar1 & 0xf0) == 0x10) {
          return (void *)0x1;
        }
      }
      ElfMemImage::SymbolIterator::Update(&SStack_68,1);
    } while (((VDSOSupport *)SStack_68.image_ != this) || (SStack_68.index_ != uVar2));
  }
  return (void *)0x0;
}

Assistant:

const void *VDSOSupport::SetBase(const void *base) {
  ABSL_RAW_CHECK(base != debugging_internal::ElfMemImage::kInvalidBase,
                 "internal error");
  const void *old_base = vdso_base_.load(std::memory_order_relaxed);
  vdso_base_.store(base, std::memory_order_relaxed);
  image_.Init(base);
  // Also reset getcpu_fn_, so GetCPU could be tested with simulated VDSO.
  getcpu_fn_.store(&InitAndGetCPU, std::memory_order_relaxed);
  return old_base;
}